

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

char * MOJOSHADER_glBestProfile
                 (MOJOSHADER_glGetProcAddress gpa,void *lookup_d,MOJOSHADER_malloc m,
                 MOJOSHADER_free f,void *malloc_d)

{
  int iVar1;
  MOJOSHADER_glGetProcAddress p_Stack_68;
  int avail;
  char *prof [6];
  void *malloc_d_local;
  MOJOSHADER_free f_local;
  MOJOSHADER_malloc m_local;
  void *lookup_d_local;
  MOJOSHADER_glGetProcAddress gpa_local;
  
  prof[5] = (char *)malloc_d;
  iVar1 = MOJOSHADER_glAvailableProfiles
                    (gpa,lookup_d,(char **)&stack0xffffffffffffff98,6,m,f,malloc_d);
  if (iVar1 < 1) {
    set_error("no profiles available");
    gpa_local = (MOJOSHADER_glGetProcAddress)0x0;
  }
  else {
    gpa_local = p_Stack_68;
  }
  return (char *)gpa_local;
}

Assistant:

const char *MOJOSHADER_glBestProfile(MOJOSHADER_glGetProcAddress gpa,
                                     void *lookup_d,
                                     MOJOSHADER_malloc m, MOJOSHADER_free f,
                                     void *malloc_d)
{
    const char *prof[STATICARRAYLEN(profile_priorities)];
    const int avail = MOJOSHADER_glAvailableProfiles(gpa, lookup_d, prof,
                                                     STATICARRAYLEN(prof),
                                                     m, f, malloc_d);
    if (avail <= 0)
    {
        set_error("no profiles available");
        return NULL;
    } // if

    return prof[0];  // profiles are sorted "best" to "worst."
}